

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::addLocalInfo
          (CoreBroker *this,BasicHandleInfo *handleInfo,ActionMessage *message)

{
  iterator iVar1;
  
  iVar1 = CLI::std::
          _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->global_id_translation)._M_h,&message->source_id);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
      ._M_cur != (__node_type *)0x0) {
    (handleInfo->local_fed_id).fid =
         *(BaseType *)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
                 ._M_cur + 0xc);
  }
  handleInfo->flags = message->flags;
  return;
}

Assistant:

void CoreBroker::addLocalInfo(BasicHandleInfo& handleInfo, const ActionMessage& message)
{
    auto res = global_id_translation.find(message.source_id);
    if (res != global_id_translation.end()) {
        handleInfo.local_fed_id = res->second;
    }
    handleInfo.flags = message.flags;
}